

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O0

void __thiscall
implementations::brainfck::BFImplementation::~BFImplementation(BFImplementation *this)

{
  BFImplementation *this_local;
  
  (this->
  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
  )._vptr_Implementation = (_func_int **)&PTR_getCurrentFrame_00175978;
  BFFrame::~BFFrame(&this->frame);
  stackless::
  Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>::
  ~Implementation(&this->
                   super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
                 );
  return;
}

Assistant:

BFImplementation(env_p _env) : Implementation(_env), frame(BFFrame(_env)) {
	}